

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::emit_mesh_entry_point(CompilerMSL *this)

{
  uint32_t id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_01;
  SPIREntryPoint *pSVar1;
  uint32_t id_00;
  SPIRFunction *pSVar2;
  SPIRFunction *pSVar3;
  SPIRBlock *pSVar4;
  mapped_type *pmVar5;
  mapped_type *this_02;
  uint32_t ret_id;
  SPIREntryPoint *local_230;
  key_type local_228;
  Instruction local_224;
  TypedID<(spirv_cross::Types)6> local_218 [2];
  SPIREntryPoint local_210;
  SPIREntryPoint proxy_ep;
  
  local_230 = Compiler::get_entry_point((Compiler *)this);
  pSVar2 = Compiler::get<spirv_cross::SPIRFunction>
                     ((Compiler *)this,
                      (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  id_00 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
  id = id_00 + 1;
  ret_id = id_00 + 2;
  pSVar3 = Compiler::
           set<spirv_cross::SPIRFunction,spirv_cross::TypedID<(spirv_cross::Types)1>&,spirv_cross::TypedID<(spirv_cross::Types)1>&>
                     ((Compiler *)this,id_00,
                      (TypedID<(spirv_cross::Types)1> *)&(pSVar2->super_IVariant).field_0xc,
                      &pSVar2->function_type);
  local_218[0].id = id;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL>::push_back
            (&pSVar3->blocks,local_218);
  (pSVar3->entry_block).id = id;
  pSVar4 = Compiler::set<spirv_cross::SPIRBlock>((Compiler *)this,id);
  *(undefined4 *)&(pSVar4->super_IVariant).field_0xc = 4;
  local_224.op = 0x39;
  local_224.count = 0;
  this_00 = &(this->super_CompilerGLSL).super_Compiler.ir.spirv;
  local_224.offset =
       (uint32_t)
       ((ulong)((long)*(pointer *)
                       ((long)&(this->super_CompilerGLSL).super_Compiler.ir.spirv.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data + 8) -
               (long)(this->super_CompilerGLSL).super_Compiler.ir.spirv.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start) >> 2);
  local_224.length = 3;
  local_218[0].id = *(uint32_t *)&(pSVar2->super_IVariant).field_0xc;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,&local_218[0].id);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&ret_id);
  pSVar1 = local_230;
  local_218[0].id = (local_230->self).id;
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (this_00,&local_218[0].id);
  SmallVector<spirv_cross::Instruction,_8UL>::push_back(&pSVar4->ops,&local_224);
  SPIREntryPoint::SPIREntryPoint(&proxy_ep,pSVar1);
  local_218[0].id = id_00;
  proxy_ep.self.id = id_00;
  SPIREntryPoint::SPIREntryPoint(&local_210,&proxy_ep);
  ::std::
  _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>,std::__detail::_Select1st,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<unsigned_int,spirv_cross::SPIREntryPoint>>
            ((_Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>,std::__detail::_Select1st,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&(this->super_CompilerGLSL).super_Compiler.ir.entry_points,local_218);
  SPIREntryPoint::~SPIREntryPoint(&local_210);
  this_01 = &(this->super_CompilerGLSL).super_Compiler.ir.meta;
  local_218[0].id = (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id;
  pmVar5 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)local_218);
  local_228.id = id_00;
  this_02 = ::std::__detail::
            _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)this_01,&local_228);
  Meta::operator=(this_02,pmVar5);
  local_218[0].id = (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id;
  pmVar5 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_01,(key_type *)local_218);
  (pmVar5->decoration).alias._M_string_length = 0;
  *(pmVar5->decoration).alias._M_dataplus._M_p = '\0';
  (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id = id_00;
  SPIREntryPoint::~SPIREntryPoint(&proxy_ep);
  return;
}

Assistant:

void CompilerMSL::emit_mesh_entry_point()
{
	auto &ep = get_entry_point();
	auto &f = get<SPIRFunction>(ir.default_entry_point);

	const uint32_t func_id = ir.increase_bound_by(3);
	const uint32_t block_id = func_id + 1;
	const uint32_t ret_id = func_id + 2;
	auto &wrapped_main = set<SPIRFunction>(func_id, f.return_type, f.function_type);

	wrapped_main.blocks.push_back(block_id);
	wrapped_main.entry_block = block_id;

	auto &wrapped_entry = set<SPIRBlock>(block_id);
	wrapped_entry.terminator = SPIRBlock::Return;

	// Push call to original 'main'
	Instruction ix = {};
	ix.op = OpFunctionCall;
	ix.offset = uint32_t(ir.spirv.size());
	ix.length = 3;

	ir.spirv.push_back(f.return_type);
	ir.spirv.push_back(ret_id);
	ir.spirv.push_back(ep.self);

	wrapped_entry.ops.push_back(ix);

	// relace entry-point for new one
	SPIREntryPoint proxy_ep = ep;
	proxy_ep.self = func_id;
	ir.entry_points.insert(std::make_pair(func_id, proxy_ep));
	ir.meta[func_id] = ir.meta[ir.default_entry_point];
	ir.meta[ir.default_entry_point].decoration.alias.clear();

	ir.default_entry_point = func_id;
}